

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_Transform(sha2_word32 *state_in,sha2_word32 *data,sha2_word32 *state_out)

{
  sha2_word32 sVar1;
  sha2_word32 sVar2;
  sha2_word32 sVar3;
  int iVar4;
  sha2_word32 sVar5;
  sha2_word32 sVar6;
  uint uVar7;
  sha2_word32 sVar8;
  uint uVar9;
  uint uVar10;
  uint local_9c;
  sha2_word32 sStack_98;
  int j;
  sha2_word32 W256 [16];
  sha2_word32 T2;
  sha2_word32 T1;
  sha2_word32 s1;
  sha2_word32 s0;
  sha2_word32 h;
  sha2_word32 g;
  sha2_word32 f;
  sha2_word32 e;
  sha2_word32 d;
  sha2_word32 c;
  sha2_word32 b;
  sha2_word32 a;
  sha2_word32 *state_out_local;
  sha2_word32 *data_local;
  sha2_word32 *state_in_local;
  
  c = *state_in;
  d = state_in[1];
  e = state_in[2];
  f = state_in[3];
  g = state_in[4];
  h = state_in[5];
  s0 = state_in[6];
  s1 = state_in[7];
  local_9c = 0;
  state_out_local = data;
  do {
    sVar1 = K256[(int)local_9c];
    sVar8 = *state_out_local;
    (&sStack_98)[(int)local_9c] = sVar8;
    iVar4 = s1 + ((g >> 6 | g << 0x1a) ^ (g >> 0xb | g << 0x15) ^ (g >> 0x19 | g << 7)) +
            (g & h ^ (g ^ 0xffffffff) & s0) + sVar1 + sVar8;
    uVar7 = c & d;
    uVar9 = c & e;
    uVar10 = d & e;
    s1 = s0;
    s0 = h;
    h = g;
    g = f + iVar4;
    f = e;
    e = d;
    d = c;
    c = iVar4 + ((c >> 2 | c << 0x1e) ^ (c >> 0xd | c << 0x13) ^ (c >> 0x16 | c << 10)) +
                (uVar7 ^ uVar9 ^ uVar10);
    local_9c = local_9c + 1;
    sVar1 = s0;
    sVar8 = h;
    sVar5 = g;
    sVar2 = e;
    sVar3 = d;
    sVar6 = c;
    state_out_local = state_out_local + 1;
  } while ((int)local_9c < 0x10);
  do {
    c = sVar6;
    d = sVar3;
    e = sVar2;
    g = sVar5;
    h = sVar8;
    s0 = sVar1;
    uVar7 = (&sStack_98)[(int)(local_9c + 1 & 0xf)];
    uVar9 = (&sStack_98)[(int)(local_9c + 0xe & 0xf)];
    sVar1 = K256[(int)local_9c];
    sVar8 = ((uVar9 >> 0x11 | uVar9 << 0xf) ^ (uVar9 >> 0x13 | uVar9 << 0xd) ^ uVar9 >> 10) +
            (&sStack_98)[(int)(local_9c + 9 & 0xf)] +
            ((uVar7 >> 7 | uVar7 << 0x19) ^ (uVar7 >> 0x12 | uVar7 << 0xe) ^ uVar7 >> 3) +
            (&sStack_98)[(int)(local_9c & 0xf)];
    (&sStack_98)[(int)(local_9c & 0xf)] = sVar8;
    iVar4 = s1 + ((g >> 6 | g << 0x1a) ^ (g >> 0xb | g << 0x15) ^ (g >> 0x19 | g << 7)) +
            (g & h ^ (g ^ 0xffffffff) & s0) + sVar1 + sVar8;
    s1 = s0;
    sVar5 = f + iVar4;
    f = e;
    sVar6 = iVar4 + ((c >> 2 | c << 0x1e) ^ (c >> 0xd | c << 0x13) ^ (c >> 0x16 | c << 10)) +
                    (c & d ^ c & e ^ d & e);
    local_9c = local_9c + 1;
    sVar1 = h;
    sVar8 = g;
    sVar2 = d;
    sVar3 = c;
  } while ((int)local_9c < 0x40);
  *state_out = *state_in + sVar6;
  state_out[1] = state_in[1] + c;
  state_out[2] = state_in[2] + d;
  state_out[3] = state_in[3] + e;
  state_out[4] = state_in[4] + sVar5;
  state_out[5] = state_in[5] + g;
  state_out[6] = state_in[6] + h;
  state_out[7] = state_in[7] + s0;
  return;
}

Assistant:

void sha256_Transform(const sha2_word32* state_in, const sha2_word32* data, sha2_word32* state_out) {
	sha2_word32	a, b, c, d, e, f, g, h, s0, s1;
	sha2_word32	T1, T2, W256[16];
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = state_in[0];
	b = state_in[1];
	c = state_in[2];
	d = state_in[3];
	e = state_in[4];
	f = state_in[5];
	g = state_in[6];
	h = state_in[7];

	j = 0;
	do {
		/* Apply the SHA-256 compression function to update a..h with copy */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + (W256[j] = *data++);
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W256[(j+1)&0x0f];
		s0 = sigma0_256(s0);
		s1 = W256[(j+14)&0x0f];	
		s1 = sigma1_256(s1);

		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + 
		     (W256[j&0x0f] += s1 + W256[(j+9)&0x0f] + s0);
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 64);

	/* Compute the current intermediate hash value */
	state_out[0] = state_in[0] + a;
	state_out[1] = state_in[1] + b;
	state_out[2] = state_in[2] + c;
	state_out[3] = state_in[3] + d;
	state_out[4] = state_in[4] + e;
	state_out[5] = state_in[5] + f;
	state_out[6] = state_in[6] + g;
	state_out[7] = state_in[7] + h;
}